

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.c
# Opt level: O1

char * al_get_config_value(ALLEGRO_CONFIG *config,char *section,char *key)

{
  bool bVar1;
  ALLEGRO_USTR *key_00;
  ALLEGRO_USTR *key_01;
  void *pvVar2;
  char *pcVar3;
  Aatree *T;
  ALLEGRO_USTR_INFO key_info;
  ALLEGRO_USTR_INFO section_info;
  ALLEGRO_USTR_INFO AStack_38;
  ALLEGRO_USTR_INFO local_28;
  
  if (section == (char *)0x0) {
    section = "";
  }
  key_00 = al_ref_cstr(&local_28,section);
  key_01 = al_ref_cstr(&AStack_38,key);
  T = (Aatree *)config->tree;
  pvVar2 = _al_aa_search(T,key_00,cmp_ustr);
  if (pvVar2 != (void *)0x0) {
    T = *(Aatree **)((long)pvVar2 + 0x18);
    pvVar2 = _al_aa_search(T,key_01,cmp_ustr);
    if (pvVar2 != (void *)0x0) {
      T = *(Aatree **)((long)pvVar2 + 0x10);
      bVar1 = true;
      goto LAB_001458c0;
    }
  }
  bVar1 = false;
LAB_001458c0:
  if (bVar1) {
    pcVar3 = al_cstr((ALLEGRO_USTR *)T);
  }
  else {
    pcVar3 = (char *)0x0;
  }
  return pcVar3;
}

Assistant:

const char *al_get_config_value(const ALLEGRO_CONFIG *config,
   const char *section, const char *key)
{
   ALLEGRO_USTR_INFO section_info;
   ALLEGRO_USTR_INFO key_info;
   const ALLEGRO_USTR *usection;
   const ALLEGRO_USTR *ukey;
   const ALLEGRO_USTR *value;

   if (section == NULL) {
      section = "";
   }

   usection = al_ref_cstr(&section_info, section);
   ukey = al_ref_cstr(&key_info, key);

   if (config_get_value(config, usection, ukey, &value))
      return al_cstr(value);
   else
      return NULL;
}